

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

void helper_xsdivqp(CPUPPCState_conflict *env,uint32_t opcode,ppc_vsr_t *xt,ppc_vsr_t *xa,
                   ppc_vsr_t *xb)

{
  uint8_t *puVar1;
  uint uVar2;
  uint uVar3;
  float128 arg;
  uintptr_t unaff_retaddr;
  float_status tstat;
  
  (env->fp_status).float_exception_flags = '\0';
  tstat = env->fp_status;
  if ((opcode & 1) != 0) {
    tstat.float_rounding_mode = '\x05';
  }
  tstat.float_exception_flags = '\0';
  arg = float128_div_ppc(xa->f128,xb->f128,&tstat);
  puVar1 = &(env->fp_status).float_exception_flags;
  *puVar1 = *puVar1 | tstat.float_exception_flags;
  if (((ulong)tstat & 0x10000) != 0) {
    uVar3 = float128_classify(xa->f128);
    uVar2 = float128_classify(xb->f128);
    float_invalid_op_div(env,true,unaff_retaddr,uVar3 | uVar2);
  }
  if ((tstat.float_exception_flags & 4) != 0) {
    float_zero_divide_excp(env,unaff_retaddr);
  }
  uVar2 = float128_classify(arg);
  uVar3 = 0;
  if (uVar2 != 0) {
    for (; (uVar2 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
    }
  }
  env->fpscr = (uint)(byte)set_fprf_from_class_fprf[(ulong)(uVar2 >> 6) + (ulong)uVar3 * 2] << 0xc |
               env->fpscr & 0xfffe0fff;
  xt->f128 = arg;
  do_float_check_status(env,unaff_retaddr);
  return;
}

Assistant:

void helper_xsdivqp(CPUPPCState *env, uint32_t opcode,
                    ppc_vsr_t *xt, ppc_vsr_t *xa, ppc_vsr_t *xb)
{
    ppc_vsr_t t = *xt;
    float_status tstat;

    helper_reset_fpstatus(env);
    tstat = env->fp_status;
    if (unlikely(Rc(opcode) != 0)) {
        tstat.float_rounding_mode = float_round_to_odd;
    }

    set_float_exception_flags(0, &tstat);
    t.f128 = float128_div(xa->f128, xb->f128, &tstat);
    env->fp_status.float_exception_flags |= tstat.float_exception_flags;

    if (unlikely(tstat.float_exception_flags & float_flag_invalid)) {
        float_invalid_op_div(env, 1, GETPC(),
                             float128_classify(xa->f128) |
                             float128_classify(xb->f128));
    }
    if (unlikely(tstat.float_exception_flags & float_flag_divbyzero)) {
        float_zero_divide_excp(env, GETPC());
    }

    helper_compute_fprf_float128(env, t.f128);
    *xt = t;
    do_float_check_status(env, GETPC());
}